

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableExpression.cpp
# Opt level: O0

void __thiscall
Kandinsky::VariableExpression::fillVariableSet
          (VariableExpression *this,
          set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
          *variableSet,BaseExpressionPtr *thisSharedPtr)

{
  VariableExpressionPtr *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  value_type *__x;
  set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  *in_stack_ffffffffffffffa0;
  value_type local_40 [2];
  
  __x = local_40;
  std::dynamic_pointer_cast<Kandinsky::VariableExpression,Kandinsky::BaseExpression>
            ((shared_ptr<Kandinsky::BaseExpression> *)__x);
  Variable::Variable((Variable *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
  std::
  set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  ::insert(in_stack_ffffffffffffffa0,__x);
  Variable::~Variable((Variable *)0x11855e);
  std::shared_ptr<Kandinsky::VariableExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::VariableExpression> *)0x118568);
  return;
}

Assistant:

void VariableExpression::fillVariableSet(std::set<Variable, VariableLessThanComparator>& variableSet, const BaseExpressionPtr& thisSharedPtr) const
    {
        variableSet.insert(Variable(std::dynamic_pointer_cast<VariableExpression>(thisSharedPtr)));
    }